

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ReLUParameter::Clear(ReLUParameter *this)

{
  ReLUParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    memset(&this->negative_slope_,0,8);
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ReLUParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ReLUParameter)
  if (_has_bits_[0 / 32] & 3u) {
    ::memset(&negative_slope_, 0, reinterpret_cast<char*>(&engine_) -
      reinterpret_cast<char*>(&negative_slope_) + sizeof(engine_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}